

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

void Gia_ManIllustrateBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint iBox;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  uVar1 = Tim_ManBoxNum(p_00);
  iVar2 = Tim_ManPiNum(p_00);
  if ((int)uVar1 < 1) {
    iVar8 = 0;
  }
  else {
    iBox = 0;
    iVar8 = 0;
    do {
      uVar3 = Tim_ManBoxInputNum(p_00,iBox);
      uVar4 = Tim_ManBoxOutputNum(p_00,iBox);
      printf("Box %4d  [%d x %d] :   ",(ulong)iBox,(ulong)uVar3,(ulong)uVar4);
      printf("Input obj IDs = ");
      if (0 < (int)uVar3) {
        lVar7 = (long)iVar8;
        uVar6 = (ulong)uVar3;
        do {
          if ((iVar8 < 0) || (p->vCos->nSize <= lVar7)) goto LAB_00668c42;
          iVar5 = p->vCos->pArray[lVar7];
          if ((iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00668c23;
          printf("%d ");
          lVar7 = lVar7 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      printf("  Output obj IDs = ");
      if (0 < (int)uVar4) {
        lVar7 = (long)iVar2;
        uVar6 = (ulong)uVar4;
        do {
          if ((iVar2 < 0) || (p->vCis->nSize <= lVar7)) {
LAB_00668c42:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar5 = p->vCis->pArray[lVar7];
          if ((iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00668c23:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          printf("%d ");
          lVar7 = lVar7 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      iVar8 = iVar8 + uVar3;
      iVar2 = iVar2 + uVar4;
      putchar(10);
      iBox = iBox + 1;
    } while (iBox != uVar1);
  }
  iVar5 = Tim_ManPoNum(p_00);
  if (iVar2 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xac,"void Gia_ManIllustrateBoxes(Gia_Man_t *)");
  }
  if (iVar5 + iVar8 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xad,"void Gia_ManIllustrateBoxes(Gia_Man_t *)");
  }
  return;
}

Assistant:

void Gia_ManIllustrateBoxes( Gia_Man_t * p )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int nBoxes = Tim_ManBoxNum( pManTime );
    int i, k, curCi, curCo, nBoxIns, nBoxOuts;
    Gia_Obj_t * pObj;
    // walk through the boxes
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < nBoxes; i++ )
    {
        nBoxIns = Tim_ManBoxInputNum(pManTime, i);
        nBoxOuts = Tim_ManBoxOutputNum(pManTime, i);
        printf( "Box %4d  [%d x %d] :   ", i, nBoxIns, nBoxOuts );
        printf( "Input obj IDs = " );
        for ( k = 0; k < nBoxIns; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            printf( "%d ", Gia_ObjId(p, pObj) );
        }
        printf( "  Output obj IDs = " );
        for ( k = 0; k < nBoxOuts; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            printf( "%d ", Gia_ObjId(p, pObj) );
        }
        curCo += nBoxIns;
        curCi += nBoxOuts;
        printf( "\n" );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
}